

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O1

Bit32u __thiscall MT32Emu::LA32WaveGenerator::getSampleStep(LA32WaveGenerator *this)

{
  undefined2 uVar1;
  Bit16u BVar2;
  
  uVar1 = this->pitch;
  BVar2 = LA32Utilites::interpolateExp(~uVar1 & 0xfff);
  return ((uint)BVar2 << (byte)(this->pitch >> 0xc)) >> 8 & 0xfffffffe;
}

Assistant:

Bit32u LA32WaveGenerator::getSampleStep() {
	// sampleStep = EXP2F(pitch / 4096.0f + 4.0f)
	Bit32u sampleStep = LA32Utilites::interpolateExp(~pitch & 4095);
	sampleStep <<= pitch >> 12;
	sampleStep >>= 8;
	sampleStep &= ~1;
	return sampleStep;
}